

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          Delimited<kj::ArrayPtr<const_unsigned_char>_> *params_1)

{
  size_t size;
  size_type extraout_RDX;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_30;
  size_t local_28;
  
  local_30 = *(undefined8 *)(this + 8);
  local_28 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::size
                       ((Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params);
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x2;
  size = sum((_ *)&local_30,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (target,(ArrayPtr<const_char> *)this,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}